

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O0

void __thiscall correctness_add_long_pow2_Test::TestBody(correctness_add_long_pow2_Test *this)

{
  bool bVar1;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  big_integer c;
  big_integer b;
  big_integer a;
  big_integer *in_stack_fffffffffffffcd0;
  undefined7 in_stack_fffffffffffffcd8;
  undefined1 in_stack_fffffffffffffcdf;
  big_integer *in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce8;
  int in_stack_fffffffffffffcec;
  int line;
  big_integer *in_stack_fffffffffffffcf0;
  undefined4 in_stack_fffffffffffffcfc;
  Type type;
  allocator<char> *in_stack_fffffffffffffd00;
  allocator<char> *__a;
  char *in_stack_fffffffffffffd08;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  Message *in_stack_fffffffffffffd48;
  AssertHelper *in_stack_fffffffffffffd50;
  AssertionResult local_268 [9];
  AssertionResult local_1d8 [9];
  AssertionResult local_148;
  allocator<char> local_131;
  string local_130 [95];
  allocator<char> local_d1;
  string local_d0 [111];
  undefined1 local_61 [57];
  string *in_stack_ffffffffffffffd8;
  big_integer *in_stack_ffffffffffffffe0;
  
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_61;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
  big_integer::big_integer(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::__cxx11::string::~string((string *)(local_61 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_61);
  __s = &local_d1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,in_stack_fffffffffffffd00);
  big_integer::big_integer(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator(&local_d1);
  __a = &local_131;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
  big_integer::big_integer(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator(&local_131);
  big_integer::big_integer
            (in_stack_fffffffffffffcf0,
             (big_integer *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
  operator+((big_integer *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
            in_stack_fffffffffffffce0);
  testing::internal::EqHelper<false>::Compare<big_integer,big_integer>
            ((char *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
             &in_stack_fffffffffffffce0->sign,
             (big_integer *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
             in_stack_fffffffffffffcd0);
  big_integer::~big_integer(in_stack_fffffffffffffcd0);
  big_integer::~big_integer(in_stack_fffffffffffffcd0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_148);
  type = CONCAT13(bVar1,(int3)in_stack_fffffffffffffcfc);
  if (!bVar1) {
    testing::Message::Message((Message *)__a);
    in_stack_fffffffffffffcf0 =
         (big_integer *)testing::AssertionResult::failure_message((AssertionResult *)0x11f47d);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)__a,type,(char *)in_stack_fffffffffffffcf0,in_stack_fffffffffffffcec,
               &in_stack_fffffffffffffce0->sign);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffcd0);
    testing::Message::~Message((Message *)0x11f4da);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11f532);
  big_integer::big_integer
            (in_stack_fffffffffffffcf0,
             (big_integer *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
  operator+((big_integer *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
            in_stack_fffffffffffffce0);
  testing::internal::EqHelper<false>::Compare<big_integer,big_integer>
            ((char *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
             &in_stack_fffffffffffffce0->sign,
             (big_integer *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
             in_stack_fffffffffffffcd0);
  big_integer::~big_integer(in_stack_fffffffffffffcd0);
  big_integer::~big_integer(in_stack_fffffffffffffcd0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1d8);
  line = CONCAT13(bVar1,(int3)in_stack_fffffffffffffcec);
  if (!bVar1) {
    testing::Message::Message((Message *)__a);
    in_stack_fffffffffffffce0 =
         (big_integer *)testing::AssertionResult::failure_message((AssertionResult *)0x11f661);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)__a,type,&in_stack_fffffffffffffcf0->sign,line,
               (char *)in_stack_fffffffffffffce0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffcd0);
    testing::Message::~Message((Message *)0x11f6be);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11f716);
  big_integer::big_integer
            (in_stack_fffffffffffffcf0,(big_integer *)CONCAT44(line,in_stack_fffffffffffffce8));
  operator+((big_integer *)CONCAT44(line,in_stack_fffffffffffffce8),in_stack_fffffffffffffce0);
  testing::internal::EqHelper<false>::Compare<big_integer,big_integer>
            ((char *)CONCAT44(line,in_stack_fffffffffffffce8),&in_stack_fffffffffffffce0->sign,
             (big_integer *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
             in_stack_fffffffffffffcd0);
  big_integer::~big_integer(in_stack_fffffffffffffcd0);
  big_integer::~big_integer(in_stack_fffffffffffffcd0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_268);
  if (!bVar1) {
    testing::Message::Message((Message *)__a);
    in_stack_fffffffffffffcd0 =
         (big_integer *)testing::AssertionResult::failure_message((AssertionResult *)0x11f836);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)__a,type,&in_stack_fffffffffffffcf0->sign,line,
               &in_stack_fffffffffffffce0->sign);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffcd0);
    testing::Message::~Message((Message *)0x11f884);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11f8d3);
  big_integer::~big_integer(in_stack_fffffffffffffcd0);
  big_integer::~big_integer(in_stack_fffffffffffffcd0);
  big_integer::~big_integer(in_stack_fffffffffffffcd0);
  return;
}

Assistant:

TEST(correctness, add_long_pow2)
{
    big_integer a( "18446744073709551616");
    big_integer b("-18446744073709551616");
    big_integer c( "36893488147419103232");

    EXPECT_EQ(a + a, c);
    EXPECT_EQ(b + c, a);
    EXPECT_EQ(c + b, a);
}